

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,Array<char> *chars)

{
  Array<char> *params;
  Array<char> *chars_local;
  HttpHeaders *this_local;
  
  params = mv<kj::Array<char>>(chars);
  Vector<kj::Array<char>>::add<kj::Array<char>>
            ((Vector<kj::Array<char>> *)&this->ownedStrings,params);
  return;
}

Assistant:

void HttpHeaders::takeOwnership(kj::Array<char>&& chars) {
  ownedStrings.add(kj::mv(chars));
}